

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode
GetScriptBufferDetails
          (JsValueRef scriptVal,JsParseScriptAttributes parseAttributes,LoadScriptFlag *scriptFlag,
          size_t *cb,byte **script)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  charcount_t cVar4;
  JsErrorCode JVar5;
  byte *pbVar6;
  LoadScriptFlag LVar7;
  
  JVar5 = JsErrorNullArgument;
  if (script != (byte **)0x0 && (cb != (size_t *)0x0 && scriptFlag != (LoadScriptFlag *)0x0)) {
    *scriptFlag = LoadScriptFlag_None;
    bVar2 = false;
    *cb = 0;
    *script = (byte *)0x0;
    bVar1 = Js::VarIs<Js::ArrayBuffer>(scriptVal);
    if (!bVar1) {
      bVar2 = Js::VarIs<Js::JavascriptString>(scriptVal);
    }
    JVar5 = JsErrorInvalidArgument;
    if ((bVar1 | bVar2) == 1) {
      if (bVar1) {
        pbVar6 = (byte *)(**(code **)(*scriptVal + 0x390))();
      }
      else {
        pbVar6 = (byte *)(**(code **)(*scriptVal + 0x328))(scriptVal);
      }
      *script = pbVar6;
      if (bVar1) {
        uVar3 = (**(code **)(*scriptVal + 0x388))(scriptVal);
        LVar7 = LoadScriptFlag_ExternalArrayBuffer|LoadScriptFlag_Utf8Source;
      }
      else {
        cVar4 = Js::JavascriptString::GetLength((JavascriptString *)scriptVal);
        uVar3 = cVar4 * 2;
        LVar7 = LoadScriptFlag_Utf8Source;
      }
      *cb = (ulong)uVar3;
      JVar5 = JsNoError;
      if ((char)((parseAttributes & JsParseScriptAttributeArrayBufferIsUtf16Encoded) >> 1) != '\0'
          || bVar2 != false) {
        LVar7 = LoadScriptFlag_None;
      }
      *scriptFlag = LVar7;
    }
  }
  return JVar5;
}

Assistant:

JsErrorCode GetScriptBufferDetails(
    _In_ JsValueRef scriptVal,
    _In_ JsParseScriptAttributes parseAttributes,
    _Out_ LoadScriptFlag* scriptFlag,
    _Out_ size_t* cb,
    _Out_ const byte** script)
{
    PARAM_NOT_NULL(scriptFlag);
    PARAM_NOT_NULL(cb);
    PARAM_NOT_NULL(script);

    *scriptFlag = LoadScriptFlag_None;
    *cb = 0;
    *script = nullptr;

    const bool isExternalArray = Js::VarIs<Js::ArrayBuffer>(scriptVal);
    const bool isString = !isExternalArray && Js::VarIs<Js::JavascriptString>(scriptVal);
    if (!isExternalArray && !isString)
    {
        return JsErrorInvalidArgument;
    }
    const bool isUtf8 = !isString && !(parseAttributes & JsParseScriptAttributeArrayBufferIsUtf16Encoded);

    *script = isExternalArray ?
        ((Js::ExternalArrayBuffer*)(scriptVal))->GetBuffer() :
        (const byte*)((Js::JavascriptString*)(scriptVal))->GetSz();
    *cb = isExternalArray ?
        ((Js::ExternalArrayBuffer*)(scriptVal))->GetByteLength() :
        ((Js::JavascriptString*)(scriptVal))->GetSizeInBytes();

    if (isExternalArray && isUtf8)
    {
        *scriptFlag = (LoadScriptFlag)(LoadScriptFlag_ExternalArrayBuffer | LoadScriptFlag_Utf8Source);
    }
    else if (isUtf8)
    {
        *scriptFlag = (LoadScriptFlag)(LoadScriptFlag_Utf8Source);
    }
    else
    {
        *scriptFlag = LoadScriptFlag_None;
    }

    return JsNoError;
}